

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# open62541.c
# Opt level: O0

UA_StatusCode ExtensionObject_encodeBinary(UA_ExtensionObject *src,UA_DataType *_)

{
  UA_DataType *pUVar1;
  UA_StatusCode UVar2;
  uint local_7c;
  size_t encode_index;
  size_t sStack_58;
  UA_Int32 signed_len;
  size_t len;
  UA_DataType *type;
  undefined1 auStack_40 [4];
  UA_StatusCode retval;
  UA_NodeId typeId;
  UA_StatusCode retval_1;
  UA_Byte encoding;
  UA_DataType *__local;
  UA_ExtensionObject *src_local;
  
  typeId.identifier.guid.data4[7] = (UA_Byte)src->encoding;
  if (typeId.identifier.guid.data4[7] < 3) {
    typeId.identifier._8_4_ = NodeId_encodeBinary(&(src->content).encoded.typeId,(UA_DataType *)0x0)
    ;
    UVar2 = Byte_encodeBinary(typeId.identifier.guid.data4 + 7,(UA_DataType *)0x0);
    typeId.identifier._8_4_ = typeId.identifier._8_4_ | UVar2;
    if (src->encoding != UA_EXTENSIONOBJECT_ENCODED_NOBODY) {
      if (src->encoding - UA_EXTENSIONOBJECT_ENCODED_BYTESTRING < 2) {
        UVar2 = ByteString_encodeBinary(&(src->content).encoded.body);
        typeId.identifier._8_4_ = UVar2 | typeId.identifier._8_4_;
      }
      else {
        typeId.identifier._8_4_ = 0x80020000;
      }
    }
    src_local._4_4_ = typeId.identifier._8_4_;
  }
  else if (((src->content).decoded.type == (UA_DataType *)0x0) ||
          ((src->content).decoded.data == (void *)0x0)) {
    src_local._4_4_ = 0x80060000;
  }
  else {
    pUVar1 = (src->content).decoded.type;
    auStack_40._0_2_ = (pUVar1->typeId).namespaceIndex;
    auStack_40._2_2_ = *(undefined2 *)&(pUVar1->typeId).field_0x2;
    unique0x00012004 = (pUVar1->typeId).identifierType;
    typeId.identifier.string.length = (size_t)(pUVar1->typeId).identifier.string.data;
    if (unique0x00012004 == 0) {
      typeId._2_2_ = 0;
      typeId.namespaceIndex = ((src->content).decoded.type)->binaryEncodingId;
      typeId.identifierType = (UA_NodeIdType)((pUVar1->typeId).identifier.string.length >> 0x20);
      type._4_4_ = NodeId_encodeBinary((UA_NodeId *)auStack_40,(UA_DataType *)0x0);
      typeId.identifier.guid.data4[7] = '\x01';
      UVar2 = Byte_encodeBinary(typeId.identifier.guid.data4 + 7,(UA_DataType *)0x0);
      type._4_4_ = UVar2 | type._4_4_;
      len = (size_t)(src->content).decoded.type;
      sStack_58 = UA_calcSizeBinary((src->content).decoded.data,(UA_DataType *)len);
      if (sStack_58 < 0x80000000) {
        encode_index._4_4_ = (undefined4)sStack_58;
        UVar2 = Int32_encodeBinary((UA_Int32 *)((long)&encode_index + 4));
        type._4_4_ = UVar2 | type._4_4_;
        if ((*(byte *)(len + 0x25) & 1) == 0) {
          local_7c = 0x19;
        }
        else {
          local_7c = (uint)*(ushort *)(len + 0x22);
        }
        UVar2 = (*encodeBinaryJumpTable[local_7c])((src->content).decoded.data,(UA_DataType *)len);
        src_local._4_4_ = UVar2 | type._4_4_;
      }
      else {
        src_local._4_4_ = 0x80060000;
      }
    }
    else {
      src_local._4_4_ = 0x80060000;
    }
  }
  return src_local._4_4_;
}

Assistant:

static UA_StatusCode
ExtensionObject_encodeBinary(UA_ExtensionObject const *src, const UA_DataType *_) {
    UA_Byte encoding = src->encoding;

    /* No content or already encoded content */
    if(encoding <= UA_EXTENSIONOBJECT_ENCODED_XML) {
        UA_StatusCode retval = NodeId_encodeBinary(&src->content.encoded.typeId, NULL);
        retval |= Byte_encodeBinary(&encoding, NULL);
        switch (src->encoding) {
        case UA_EXTENSIONOBJECT_ENCODED_NOBODY:
            break;
        case UA_EXTENSIONOBJECT_ENCODED_BYTESTRING:
        case UA_EXTENSIONOBJECT_ENCODED_XML:
            retval |= ByteString_encodeBinary(&src->content.encoded.body);
            break;
        default:
            retval = UA_STATUSCODE_BADINTERNALERROR;
        }
        return retval;
    }

    /* Cannot encode with no data or no type description */
    if(!src->content.decoded.type || !src->content.decoded.data)
        return UA_STATUSCODE_BADENCODINGERROR;

    /* Write the NodeId for the binary encoded type */
    UA_NodeId typeId = src->content.decoded.type->typeId;
    if(typeId.identifierType != UA_NODEIDTYPE_NUMERIC)
        return UA_STATUSCODE_BADENCODINGERROR;
    typeId.identifier.numeric = src->content.decoded.type->binaryEncodingId;
    UA_StatusCode retval = NodeId_encodeBinary(&typeId, NULL);

    /* Write the encoding byte */
    encoding = UA_EXTENSIONOBJECT_ENCODED_BYTESTRING;
    retval |= Byte_encodeBinary(&encoding, NULL);

    /* Write the length of the following content */
    const UA_DataType *type = src->content.decoded.type;
    size_t len = UA_calcSizeBinary(src->content.decoded.data, type);
    if(len > UA_INT32_MAX)
        return UA_STATUSCODE_BADENCODINGERROR;
    UA_Int32 signed_len = (UA_Int32)len;
    retval |= Int32_encodeBinary(&signed_len);

    /* Encode the content */
    size_t encode_index = type->builtin ? type->typeIndex : UA_BUILTIN_TYPES_COUNT;
    retval |= encodeBinaryJumpTable[encode_index](src->content.decoded.data, type);
    return retval;
}